

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersector1<4,_16777232,_true,_embree::avx2::SubGridMBIntersector1Pluecker<4,_true>_>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  ushort uVar3;
  ushort uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  AABBNodeMB4D *node1;
  ulong uVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  RTCIntersectArguments *pRVar33;
  undefined4 uVar34;
  Geometry *pGVar35;
  ulong uVar36;
  ulong *puVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  vint4 ai;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  vint4 bi;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  float fVar75;
  float fVar76;
  vint4 ai_1;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar77;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  vint4 bi_1;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar89;
  float fVar96;
  float fVar97;
  vint4 bi_7;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  undefined1 auVar98 [16];
  undefined1 auVar100 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  float fVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  float fVar124;
  undefined1 auVar120 [32];
  float fVar122;
  float fVar123;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar121 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  float fVar139;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar145 [64];
  float fVar152;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar156 [64];
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  float fVar168;
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar171 [64];
  UVIdentity<8> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  vint4 bi_5;
  vint4 bi_2;
  NodeRef stack [244];
  undefined1 local_d31;
  Ray *local_d30;
  RayQueryContext *local_d28;
  uint local_d1c;
  uint local_d18;
  int local_d14;
  ulong *local_d10;
  ulong local_d08;
  undefined1 local_d00 [32];
  undefined1 local_ce0 [32];
  long local_cb0;
  ulong local_ca8;
  ulong local_ca0;
  ulong local_c98;
  long local_c90;
  long local_c88;
  ulong local_c80;
  long local_c78;
  long local_c70;
  Scene *local_c68;
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  float local_c20;
  float local_c1c;
  undefined4 local_c18;
  undefined4 local_c14;
  undefined4 local_c10;
  undefined4 local_c0c;
  undefined4 local_c08;
  uint local_c04;
  uint local_c00;
  RTCFilterFunctionNArguments local_bf0;
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [32];
  undefined1 local_b80 [48];
  undefined1 local_b50 [16];
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  undefined1 local_b20 [16];
  undefined1 local_b10 [16];
  float local_b00;
  float fStack_afc;
  float fStack_af8;
  float fStack_af4;
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  float local_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  float local_a40;
  float fStack_a3c;
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  undefined1 local_9a0 [32];
  undefined4 local_980;
  undefined4 uStack_97c;
  undefined4 uStack_978;
  undefined4 uStack_974;
  undefined4 uStack_970;
  undefined4 uStack_96c;
  undefined4 uStack_968;
  undefined4 uStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 *local_900;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [32];
  ulong local_800 [250];
  
  local_800[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_800[0] != 8) {
    fVar136 = ray->tfar;
    if (0.0 <= fVar136) {
      puVar37 = local_800 + 1;
      auVar42 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar1 = (ray->dir).field_0;
      auVar49._8_4_ = 0x7fffffff;
      auVar49._0_8_ = 0x7fffffff7fffffff;
      auVar49._12_4_ = 0x7fffffff;
      auVar49 = vandps_avx((undefined1  [16])aVar1,auVar49);
      auVar78._8_4_ = 0x219392ef;
      auVar78._0_8_ = 0x219392ef219392ef;
      auVar78._12_4_ = 0x219392ef;
      auVar49 = vcmpps_avx(auVar49,auVar78,1);
      auVar79._8_4_ = 0x3f800000;
      auVar79._0_8_ = 0x3f8000003f800000;
      auVar79._12_4_ = 0x3f800000;
      auVar78 = vdivps_avx(auVar79,(undefined1  [16])aVar1);
      auVar80._8_4_ = 0x5d5e0b6b;
      auVar80._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar80._12_4_ = 0x5d5e0b6b;
      auVar49 = vblendvps_avx(auVar78,auVar80,auVar49);
      auVar67._0_4_ = auVar49._0_4_ * 0.99999964;
      auVar67._4_4_ = auVar49._4_4_ * 0.99999964;
      auVar67._8_4_ = auVar49._8_4_ * 0.99999964;
      auVar67._12_4_ = auVar49._12_4_ * 0.99999964;
      auVar56._0_4_ = auVar49._0_4_ * 1.0000004;
      auVar56._4_4_ = auVar49._4_4_ * 1.0000004;
      auVar56._8_4_ = auVar49._8_4_ * 1.0000004;
      auVar56._12_4_ = auVar49._12_4_ * 1.0000004;
      uVar34 = *(undefined4 *)&(ray->org).field_0;
      local_b50._4_4_ = uVar34;
      local_b50._0_4_ = uVar34;
      local_b50._8_4_ = uVar34;
      local_b50._12_4_ = uVar34;
      auVar115 = ZEXT1664(local_b50);
      uVar34 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_ab0._4_4_ = uVar34;
      local_ab0._0_4_ = uVar34;
      local_ab0._8_4_ = uVar34;
      local_ab0._12_4_ = uVar34;
      auVar121 = ZEXT1664(local_ab0);
      uVar34 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_ac0._4_4_ = uVar34;
      local_ac0._0_4_ = uVar34;
      local_ac0._8_4_ = uVar34;
      local_ac0._12_4_ = uVar34;
      auVar132 = ZEXT1664(local_ac0);
      auVar49 = vmovshdup_avx(auVar67);
      local_ae0 = vshufps_avx(auVar67,auVar67,0x55);
      auVar145 = ZEXT1664(local_ae0);
      auVar78 = vshufpd_avx(auVar67,auVar67,1);
      local_af0 = vshufps_avx(auVar67,auVar67,0xaa);
      auVar156 = ZEXT1664(local_af0);
      local_b10 = vshufps_avx(auVar56,auVar56,0x55);
      auVar167 = ZEXT1664(local_b10);
      local_b20 = vshufps_avx(auVar56,auVar56,0xaa);
      auVar171 = ZEXT1664(local_b20);
      uVar27 = (ulong)(auVar67._0_4_ < 0.0) << 4;
      uVar38 = (ulong)(auVar49._0_4_ < 0.0) << 4 | 0x20;
      uVar39 = (ulong)(auVar78._0_4_ < 0.0) << 4 | 0x40;
      uVar40 = uVar27 ^ 0x10;
      uVar41 = uVar38 ^ 0x10;
      uVar34 = auVar42._0_4_;
      local_b30._4_4_ = uVar34;
      local_b30._0_4_ = uVar34;
      local_b30._8_4_ = uVar34;
      local_b30._12_4_ = uVar34;
      auVar95 = ZEXT1664(local_b30);
      local_b40._4_4_ = fVar136;
      local_b40._0_4_ = fVar136;
      local_b40._8_4_ = fVar136;
      local_b40._12_4_ = fVar136;
      auVar108 = ZEXT1664(local_b40);
      local_a00._16_16_ = mm_lookupmask_ps._240_16_;
      local_a00._0_16_ = mm_lookupmask_ps._240_16_;
      local_9a0 = vperm2f128_avx(local_a00,mm_lookupmask_ps._0_32_,2);
      auVar60._8_4_ = 0x3f800000;
      auVar60._0_8_ = 0x3f8000003f800000;
      auVar60._12_4_ = 0x3f800000;
      auVar60._16_4_ = 0x3f800000;
      auVar60._20_4_ = 0x3f800000;
      auVar60._24_4_ = 0x3f800000;
      auVar60._28_4_ = 0x3f800000;
      auVar86._8_4_ = 0xbf800000;
      auVar86._0_8_ = 0xbf800000bf800000;
      auVar86._12_4_ = 0xbf800000;
      auVar86._16_4_ = 0xbf800000;
      auVar86._20_4_ = 0xbf800000;
      auVar86._24_4_ = 0xbf800000;
      auVar86._28_4_ = 0xbf800000;
      _local_9c0 = vblendvps_avx(auVar60,auVar86,local_9a0);
      local_ca0 = uVar27;
      local_ad0 = auVar67._0_4_;
      fStack_acc = auVar67._0_4_;
      fStack_ac8 = auVar67._0_4_;
      fStack_ac4 = auVar67._0_4_;
      local_b00 = auVar56._0_4_;
      fStack_afc = auVar56._0_4_;
      fStack_af8 = auVar56._0_4_;
      fStack_af4 = auVar56._0_4_;
      local_ca8 = uVar38;
      fVar136 = auVar67._0_4_;
      fVar137 = auVar67._0_4_;
      fVar138 = auVar67._0_4_;
      fVar162 = auVar56._0_4_;
      fVar163 = auVar56._0_4_;
      fVar164 = auVar56._0_4_;
      local_d30 = ray;
      local_d28 = context;
LAB_014a8699:
      if (puVar37 != local_800) {
        uVar36 = puVar37[-1];
        puVar37 = puVar37 + -1;
LAB_014a86aa:
        uVar34 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
        auVar42._4_4_ = uVar34;
        auVar42._0_4_ = uVar34;
        auVar42._8_4_ = uVar34;
        auVar42._12_4_ = uVar34;
        while ((uVar36 & 8) == 0) {
          uVar24 = uVar36 & 0xfffffffffffffff0;
          auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + uVar27),auVar42,
                                    *(undefined1 (*) [16])(uVar24 + 0x20 + uVar27));
          auVar49 = vsubps_avx(auVar49,auVar115._0_16_);
          auVar48._0_4_ = auVar67._0_4_ * auVar49._0_4_;
          auVar48._4_4_ = fVar136 * auVar49._4_4_;
          auVar48._8_4_ = fVar137 * auVar49._8_4_;
          auVar48._12_4_ = fVar138 * auVar49._12_4_;
          auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + uVar38),auVar42,
                                    *(undefined1 (*) [16])(uVar24 + 0x20 + uVar38));
          auVar49 = vsubps_avx(auVar49,auVar121._0_16_);
          auVar57._0_4_ = auVar145._0_4_ * auVar49._0_4_;
          auVar57._4_4_ = auVar145._4_4_ * auVar49._4_4_;
          auVar57._8_4_ = auVar145._8_4_ * auVar49._8_4_;
          auVar57._12_4_ = auVar145._12_4_ * auVar49._12_4_;
          auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + uVar39),auVar42,
                                    *(undefined1 (*) [16])(uVar24 + 0x20 + uVar39));
          auVar49 = vsubps_avx(auVar49,auVar132._0_16_);
          auVar68._0_4_ = auVar156._0_4_ * auVar49._0_4_;
          auVar68._4_4_ = auVar156._4_4_ * auVar49._4_4_;
          auVar68._8_4_ = auVar156._8_4_ * auVar49._8_4_;
          auVar68._12_4_ = auVar156._12_4_ * auVar49._12_4_;
          auVar49 = vmaxps_avx(auVar57,auVar68);
          auVar78 = vmaxps_avx(auVar95._0_16_,auVar48);
          auVar49 = vmaxps_avx(auVar78,auVar49);
          auVar78 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + uVar40),auVar42,
                                    *(undefined1 (*) [16])(uVar24 + 0x20 + uVar40));
          auVar78 = vsubps_avx(auVar78,auVar115._0_16_);
          auVar58._0_4_ = auVar56._0_4_ * auVar78._0_4_;
          auVar58._4_4_ = fVar162 * auVar78._4_4_;
          auVar58._8_4_ = fVar163 * auVar78._8_4_;
          auVar58._12_4_ = fVar164 * auVar78._12_4_;
          auVar78 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + uVar41),auVar42,
                                    *(undefined1 (*) [16])(uVar24 + 0x20 + uVar41));
          auVar78 = vsubps_avx(auVar78,auVar121._0_16_);
          auVar79 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + (uVar39 ^ 0x10)),auVar42,
                                    *(undefined1 (*) [16])(uVar24 + 0x20 + (uVar39 ^ 0x10)));
          auVar69._0_4_ = auVar167._0_4_ * auVar78._0_4_;
          auVar69._4_4_ = auVar167._4_4_ * auVar78._4_4_;
          auVar69._8_4_ = auVar167._8_4_ * auVar78._8_4_;
          auVar69._12_4_ = auVar167._12_4_ * auVar78._12_4_;
          auVar78 = vsubps_avx(auVar79,auVar132._0_16_);
          auVar81._0_4_ = auVar171._0_4_ * auVar78._0_4_;
          auVar81._4_4_ = auVar171._4_4_ * auVar78._4_4_;
          auVar81._8_4_ = auVar171._8_4_ * auVar78._8_4_;
          auVar81._12_4_ = auVar171._12_4_ * auVar78._12_4_;
          auVar78 = vminps_avx(auVar69,auVar81);
          auVar79 = vminps_avx(auVar108._0_16_,auVar58);
          auVar78 = vminps_avx(auVar79,auVar78);
          auVar49 = vcmpps_avx(auVar49,auVar78,2);
          if (((uint)uVar36 & 7) == 6) {
            auVar78 = vcmpps_avx(*(undefined1 (*) [16])(uVar24 + 0xe0),auVar42,2);
            auVar79 = vcmpps_avx(auVar42,*(undefined1 (*) [16])(uVar24 + 0xf0),1);
            auVar78 = vandps_avx(auVar78,auVar79);
            auVar49 = vandps_avx(auVar78,auVar49);
          }
          auVar49 = vpslld_avx(auVar49,0x1f);
          uVar28 = vmovmskps_avx(auVar49);
          if (uVar28 == 0) goto LAB_014a8699;
          This = (Intersectors *)0x0;
          for (uVar36 = (ulong)(byte)uVar28; (uVar36 & 1) == 0;
              uVar36 = uVar36 >> 1 | 0x8000000000000000) {
            This = (Intersectors *)((long)&This->ptr + 1);
          }
          uVar36 = *(ulong *)(uVar24 + (long)This * 8);
          uVar28 = (uVar28 & 0xff) - 1 & uVar28 & 0xff;
          uVar29 = (ulong)uVar28;
          if (uVar28 != 0) goto LAB_014a87e1;
        }
        uVar24 = uVar36 & 0xfffffffffffffff0;
        local_d10 = puVar37;
        local_cb0 = (ulong)((uint)uVar36 & 0xf) - 8;
        for (local_c88 = 0; local_c88 != local_cb0; local_c88 = local_c88 + 1) {
          lVar25 = local_c88 * 0x90;
          uVar36 = *(ulong *)(uVar24 + 0x20 + lVar25);
          auVar43._8_8_ = 0;
          auVar43._0_8_ = uVar36;
          auVar49 = vpmovzxbd_avx(auVar43);
          auVar49 = vcvtdq2ps_avx(auVar49);
          uVar34 = *(undefined4 *)(uVar24 + 0x44 + lVar25);
          auVar90._4_4_ = uVar34;
          auVar90._0_4_ = uVar34;
          auVar90._8_4_ = uVar34;
          auVar90._12_4_ = uVar34;
          uVar34 = *(undefined4 *)(uVar24 + 0x38 + lVar25);
          auVar98._4_4_ = uVar34;
          auVar98._0_4_ = uVar34;
          auVar98._8_4_ = uVar34;
          auVar98._12_4_ = uVar34;
          auVar42 = vfmadd213ps_fma(auVar49,auVar90,auVar98);
          auVar70._8_8_ = 0;
          auVar70._0_8_ = *(ulong *)(uVar24 + 0x50 + lVar25);
          auVar49 = vpmovzxbd_avx(auVar70);
          auVar49 = vcvtdq2ps_avx(auVar49);
          uVar34 = *(undefined4 *)(uVar24 + 0x74 + lVar25);
          auVar109._4_4_ = uVar34;
          auVar109._0_4_ = uVar34;
          auVar109._8_4_ = uVar34;
          auVar109._12_4_ = uVar34;
          uVar34 = *(undefined4 *)(uVar24 + 0x68 + lVar25);
          auVar117._4_4_ = uVar34;
          auVar117._0_4_ = uVar34;
          auVar117._8_4_ = uVar34;
          auVar117._12_4_ = uVar34;
          auVar56 = vfmadd213ps_fma(auVar49,auVar109,auVar117);
          auVar50._8_8_ = 0;
          auVar50._0_8_ = *(ulong *)(uVar24 + 0x24 + lVar25);
          auVar49 = vpmovzxbd_avx(auVar50);
          auVar49 = vcvtdq2ps_avx(auVar49);
          auVar67 = vfmadd213ps_fma(auVar49,auVar90,auVar98);
          auVar91._8_8_ = 0;
          auVar91._0_8_ = *(ulong *)(uVar24 + 0x54 + lVar25);
          auVar49 = vpmovzxbd_avx(auVar91);
          auVar49 = vcvtdq2ps_avx(auVar49);
          auVar79 = vfmadd213ps_fma(auVar49,auVar109,auVar117);
          auVar99._8_8_ = 0;
          auVar99._0_8_ = *(ulong *)(uVar24 + 0x28 + lVar25);
          auVar49 = vpmovzxbd_avx(auVar99);
          auVar49 = vcvtdq2ps_avx(auVar49);
          uVar34 = *(undefined4 *)(uVar24 + 0x48 + lVar25);
          auVar128._4_4_ = uVar34;
          auVar128._0_4_ = uVar34;
          auVar128._8_4_ = uVar34;
          auVar128._12_4_ = uVar34;
          uVar34 = *(undefined4 *)(uVar24 + 0x3c + lVar25);
          auVar133._4_4_ = uVar34;
          auVar133._0_4_ = uVar34;
          auVar133._8_4_ = uVar34;
          auVar133._12_4_ = uVar34;
          auVar80 = vfmadd213ps_fma(auVar49,auVar128,auVar133);
          auVar110._8_8_ = 0;
          auVar110._0_8_ = *(ulong *)(uVar24 + 0x58 + lVar25);
          auVar49 = vpmovzxbd_avx(auVar110);
          auVar49 = vcvtdq2ps_avx(auVar49);
          uVar34 = *(undefined4 *)(uVar24 + 0x78 + lVar25);
          auVar140._4_4_ = uVar34;
          auVar140._0_4_ = uVar34;
          auVar140._8_4_ = uVar34;
          auVar140._12_4_ = uVar34;
          uVar34 = *(undefined4 *)(uVar24 + 0x6c + lVar25);
          auVar153._4_4_ = uVar34;
          auVar153._0_4_ = uVar34;
          auVar153._8_4_ = uVar34;
          auVar153._12_4_ = uVar34;
          auVar70 = vfmadd213ps_fma(auVar49,auVar140,auVar153);
          auVar118._8_8_ = 0;
          auVar118._0_8_ = *(ulong *)(uVar24 + 0x2c + lVar25);
          auVar49 = vpmovzxbd_avx(auVar118);
          auVar49 = vcvtdq2ps_avx(auVar49);
          auVar44 = vfmadd213ps_fma(auVar49,auVar128,auVar133);
          auVar129._8_8_ = 0;
          auVar129._0_8_ = *(ulong *)(uVar24 + 0x5c + lVar25);
          auVar49 = vpmovzxbd_avx(auVar129);
          auVar49 = vcvtdq2ps_avx(auVar49);
          auVar51 = vfmadd213ps_fma(auVar49,auVar140,auVar153);
          auVar134._8_8_ = 0;
          auVar134._0_8_ = *(ulong *)(uVar24 + 0x30 + lVar25);
          auVar49 = vpmovzxbd_avx(auVar134);
          auVar49 = vcvtdq2ps_avx(auVar49);
          uVar34 = *(undefined4 *)(uVar24 + 0x4c + lVar25);
          auVar141._4_4_ = uVar34;
          auVar141._0_4_ = uVar34;
          auVar141._8_4_ = uVar34;
          auVar141._12_4_ = uVar34;
          uVar34 = *(undefined4 *)(uVar24 + 0x40 + lVar25);
          auVar154._4_4_ = uVar34;
          auVar154._0_4_ = uVar34;
          auVar154._8_4_ = uVar34;
          auVar154._12_4_ = uVar34;
          auVar59 = vfmadd213ps_fma(auVar49,auVar141,auVar154);
          auVar160._8_8_ = 0;
          auVar160._0_8_ = *(ulong *)(uVar24 + 0x60 + lVar25);
          auVar49 = vpmovzxbd_avx(auVar160);
          auVar49 = vcvtdq2ps_avx(auVar49);
          uVar34 = *(undefined4 *)(uVar24 + 0x7c + lVar25);
          auVar165._4_4_ = uVar34;
          auVar165._0_4_ = uVar34;
          auVar165._8_4_ = uVar34;
          auVar165._12_4_ = uVar34;
          auVar169._8_8_ = 0;
          auVar169._0_8_ = *(ulong *)(uVar24 + 0x34 + lVar25);
          auVar78 = vpmovzxbd_avx(auVar169);
          auVar78 = vcvtdq2ps_avx(auVar78);
          auVar78 = vfmadd213ps_fma(auVar78,auVar141,auVar154);
          uVar34 = *(undefined4 *)(uVar24 + 0x70 + lVar25);
          auVar142._4_4_ = uVar34;
          auVar142._0_4_ = uVar34;
          auVar142._8_4_ = uVar34;
          auVar142._12_4_ = uVar34;
          auVar71 = vfmadd213ps_fma(auVar49,auVar165,auVar142);
          auVar155._8_8_ = 0;
          auVar155._0_8_ = *(ulong *)(uVar24 + 100 + lVar25);
          auVar49 = vpmovzxbd_avx(auVar155);
          auVar49 = vcvtdq2ps_avx(auVar49);
          auVar82 = vfmadd213ps_fma(auVar49,auVar165,auVar142);
          fVar136 = ((ray->dir).field_0.m128[3] - *(float *)(uVar24 + 0x80 + lVar25)) *
                    *(float *)(uVar24 + 0x84 + lVar25);
          auVar143._4_4_ = fVar136;
          auVar143._0_4_ = fVar136;
          auVar143._8_4_ = fVar136;
          auVar143._12_4_ = fVar136;
          auVar49 = vsubps_avx(auVar56,auVar42);
          auVar42 = vfmadd213ps_fma(auVar49,auVar143,auVar42);
          auVar49 = vsubps_avx(auVar79,auVar67);
          auVar56 = vfmadd213ps_fma(auVar49,auVar143,auVar67);
          auVar49 = vsubps_avx(auVar70,auVar80);
          auVar67 = vfmadd213ps_fma(auVar49,auVar143,auVar80);
          auVar49 = vsubps_avx(auVar51,auVar44);
          auVar79 = vfmadd213ps_fma(auVar49,auVar143,auVar44);
          auVar49 = vsubps_avx(auVar71,auVar59);
          auVar80 = vfmadd213ps_fma(auVar49,auVar143,auVar59);
          auVar49 = vsubps_avx(auVar82,auVar78);
          auVar70 = vfmadd213ps_fma(auVar49,auVar143,auVar78);
          auVar49 = vpminub_avx(auVar43,auVar50);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar36;
          auVar49 = vpcmpeqb_avx(auVar44,auVar49);
          local_d00._0_16_ = auVar49;
          auVar86 = local_d00;
          auVar78 = vsubps_avx(auVar42,local_b50);
          auVar51._0_4_ = local_ad0 * auVar78._0_4_;
          auVar51._4_4_ = fStack_acc * auVar78._4_4_;
          auVar51._8_4_ = fStack_ac8 * auVar78._8_4_;
          auVar51._12_4_ = fStack_ac4 * auVar78._12_4_;
          auVar78 = vsubps_avx(auVar67,local_ab0);
          auVar71._0_4_ = local_ae0._0_4_ * auVar78._0_4_;
          auVar71._4_4_ = local_ae0._4_4_ * auVar78._4_4_;
          auVar71._8_4_ = local_ae0._8_4_ * auVar78._8_4_;
          auVar71._12_4_ = local_ae0._12_4_ * auVar78._12_4_;
          auVar78 = vsubps_avx(auVar56,local_b50);
          auVar59._0_4_ = local_b00 * auVar78._0_4_;
          auVar59._4_4_ = fStack_afc * auVar78._4_4_;
          auVar59._8_4_ = fStack_af8 * auVar78._8_4_;
          auVar59._12_4_ = fStack_af4 * auVar78._12_4_;
          auVar78 = vsubps_avx(auVar79,local_ab0);
          auVar82._0_4_ = local_b10._0_4_ * auVar78._0_4_;
          auVar82._4_4_ = local_b10._4_4_ * auVar78._4_4_;
          auVar82._8_4_ = local_b10._8_4_ * auVar78._8_4_;
          auVar82._12_4_ = local_b10._12_4_ * auVar78._12_4_;
          auVar42 = vpminsd_avx(auVar51,auVar59);
          auVar78 = vpmaxsd_avx(auVar51,auVar59);
          auVar56 = vpminsd_avx(auVar71,auVar82);
          auVar42 = vpmaxsd_avx(auVar42,auVar56);
          auVar56 = vpmaxsd_avx(auVar71,auVar82);
          auVar67 = vsubps_avx(auVar80,local_ac0);
          auVar83._0_4_ = local_af0._0_4_ * auVar67._0_4_;
          auVar83._4_4_ = local_af0._4_4_ * auVar67._4_4_;
          auVar83._8_4_ = local_af0._8_4_ * auVar67._8_4_;
          auVar83._12_4_ = local_af0._12_4_ * auVar67._12_4_;
          auVar67 = vsubps_avx(auVar70,local_ac0);
          auVar92._0_4_ = local_b20._0_4_ * auVar67._0_4_;
          auVar92._4_4_ = local_b20._4_4_ * auVar67._4_4_;
          auVar92._8_4_ = local_b20._8_4_ * auVar67._8_4_;
          auVar92._12_4_ = local_b20._12_4_ * auVar67._12_4_;
          auVar67 = vpminsd_avx(auVar78,auVar56);
          auVar56 = vpminsd_avx(auVar83,auVar92);
          auVar78 = vpmaxsd_avx(auVar83,auVar92);
          auVar56 = vpmaxsd_avx(auVar56,local_b30);
          auVar42 = vpmaxsd_avx(auVar42,auVar56);
          auVar78 = vpminsd_avx(auVar78,local_b40);
          auVar78 = vpminsd_avx(auVar67,auVar78);
          auVar78 = vpcmpgtd_avx(auVar42,auVar78);
          local_d00._0_4_ = auVar49._0_4_;
          auVar49 = vpmovsxbd_avx(ZEXT416((uint)local_d00._0_4_));
          auVar49 = vpandn_avx(auVar78,auVar49);
          uVar34 = vmovmskps_avx(auVar49);
          uVar36 = CONCAT44((int)((ulong)This >> 0x20),uVar34);
          local_c90 = uVar24 + lVar25;
          local_d00 = auVar86;
          while( true ) {
            auVar171 = ZEXT1664(local_b20);
            auVar167 = ZEXT1664(local_b10);
            auVar156 = ZEXT1664(local_af0);
            auVar145 = ZEXT1664(local_ae0);
            auVar132 = ZEXT1664(local_ac0);
            auVar121 = ZEXT1664(local_ab0);
            auVar108 = ZEXT1664(local_b40);
            auVar95 = ZEXT1664(local_b30);
            if (uVar36 == 0) break;
            local_c80 = uVar36;
            lVar25 = 0;
            for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
              lVar25 = lVar25 + 1;
            }
            uVar3 = *(ushort *)(local_c90 + lVar25 * 8);
            uVar4 = *(ushort *)(local_c90 + 2 + lVar25 * 8);
            local_d08 = (ulong)*(uint *)(local_c90 + 0x88);
            local_c98 = (ulong)*(uint *)(local_c90 + 4 + lVar25 * 8);
            local_c68 = context->scene;
            pGVar35 = (local_c68->geometries).items[local_d08].ptr;
            local_c70 = *(long *)&pGVar35->field_0x58;
            local_c78 = pGVar35[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
                        * local_c98;
            fVar136 = (pGVar35->time_range).lower;
            fVar136 = pGVar35->fnumTimeSegments *
                      (((ray->dir).field_0.m128[3] - fVar136) /
                      ((pGVar35->time_range).upper - fVar136));
            auVar49 = vroundss_avx(ZEXT416((uint)fVar136),ZEXT416((uint)fVar136),9);
            auVar49 = vminss_avx(auVar49,ZEXT416((uint)(pGVar35->fnumTimeSegments + -1.0)));
            auVar56 = vmaxss_avx((undefined1  [16])0x0,auVar49);
            local_d18 = uVar3 & 0x7fff;
            local_d1c = uVar4 & 0x7fff;
            uVar28 = *(uint *)(local_c70 + 4 + local_c78);
            uVar36 = (ulong)uVar28;
            uVar38 = (ulong)(uVar28 * local_d1c + *(int *)(local_c70 + local_c78) + local_d18);
            lVar5 = *(long *)&pGVar35[2].numPrimitives;
            lVar30 = (long)(int)auVar56._0_4_ * 0x38;
            lVar6 = *(long *)(lVar5 + 0x10 + lVar30);
            lVar7 = *(long *)(lVar5 + lVar30);
            auVar49 = *(undefined1 (*) [16])(lVar7 + lVar6 * uVar38);
            lVar8 = *(long *)(lVar5 + 0x48 + lVar30);
            auVar67 = *(undefined1 (*) [16])(lVar7 + (uVar38 + 1) * lVar6);
            lVar25 = uVar38 + uVar36;
            auVar78 = *(undefined1 (*) [16])(lVar7 + lVar25 * lVar6);
            lVar32 = uVar38 + uVar36 + 1;
            auVar79 = *(undefined1 (*) [16])(lVar7 + lVar32 * lVar6);
            lVar26 = uVar38 + (-1 < (short)uVar3) + 1;
            auVar80 = *(undefined1 (*) [16])(lVar7 + lVar26 * lVar6);
            lVar31 = (ulong)(-1 < (short)uVar3) + lVar32;
            auVar42 = *(undefined1 (*) [16])(lVar7 + lVar31 * lVar6);
            local_aa0._0_8_ = lVar8 * lVar31;
            uVar27 = 0;
            if (-1 < (short)uVar4) {
              uVar27 = uVar36;
            }
            auVar70 = *(undefined1 (*) [16])(lVar7 + (lVar25 + uVar27) * lVar6);
            auVar44 = *(undefined1 (*) [16])(lVar7 + (lVar32 + uVar27) * lVar6);
            auVar51 = *(undefined1 (*) [16])(lVar7 + lVar6 * (uVar27 + lVar31));
            lVar5 = *(long *)(lVar5 + 0x38 + lVar30);
            fVar136 = fVar136 - auVar56._0_4_;
            auVar45._4_4_ = fVar136;
            auVar45._0_4_ = fVar136;
            auVar45._8_4_ = fVar136;
            auVar45._12_4_ = fVar136;
            auVar56 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * uVar38),auVar49);
            auVar59 = vfmadd213ps_fma(auVar56,auVar45,auVar49);
            auVar49 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * (uVar38 + 1)),auVar67);
            auVar71 = vfmadd213ps_fma(auVar49,auVar45,auVar67);
            auVar49 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * lVar25),auVar78);
            auVar82 = vfmadd213ps_fma(auVar49,auVar45,auVar78);
            auVar49 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * lVar32),auVar79);
            auVar43 = vfmadd213ps_fma(auVar49,auVar45,auVar79);
            auVar49 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * lVar26),auVar80);
            auVar78 = vfmadd213ps_fma(auVar49,auVar45,auVar80);
            auVar49 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * lVar31),auVar42);
            auVar50 = vfmadd213ps_fma(auVar49,auVar45,auVar42);
            auVar49 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * (lVar25 + uVar27)),auVar70);
            auVar70 = vfmadd213ps_fma(auVar49,auVar45,auVar70);
            auVar49 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * (lVar32 + uVar27)),auVar44);
            auVar44 = vfmadd213ps_fma(auVar49,auVar45,auVar44);
            auVar49 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + (uVar27 + lVar31) * lVar8),auVar51);
            auVar51 = vfmadd213ps_fma(auVar49,auVar45,auVar51);
            auVar42 = vunpcklps_avx(auVar71,auVar50);
            auVar49 = vunpckhps_avx(auVar71,auVar50);
            auVar56 = vunpcklps_avx(auVar78,auVar43);
            auVar78 = vunpckhps_avx(auVar78,auVar43);
            auVar67 = vunpcklps_avx(auVar49,auVar78);
            auVar79 = vunpcklps_avx(auVar42,auVar56);
            auVar49 = vunpckhps_avx(auVar42,auVar56);
            auVar56 = vunpcklps_avx(auVar82,auVar44);
            auVar78 = vunpckhps_avx(auVar82,auVar44);
            auVar80 = vunpcklps_avx(auVar43,auVar70);
            auVar42 = vunpckhps_avx(auVar43,auVar70);
            auVar42 = vunpcklps_avx(auVar78,auVar42);
            auVar70 = vunpcklps_avx(auVar56,auVar80);
            auVar78 = vunpckhps_avx(auVar56,auVar80);
            auVar101._16_16_ = auVar44;
            auVar101._0_16_ = auVar82;
            auVar52._16_16_ = auVar50;
            auVar52._0_16_ = auVar71;
            auVar86 = vunpcklps_avx(auVar52,auVar101);
            auVar72._16_16_ = auVar51;
            auVar72._0_16_ = auVar43;
            auVar61._16_16_ = auVar43;
            auVar61._0_16_ = auVar59;
            auVar60 = vunpcklps_avx(auVar61,auVar72);
            auVar46 = vunpcklps_avx(auVar60,auVar86);
            auVar86 = vunpckhps_avx(auVar60,auVar86);
            auVar60 = vunpckhps_avx(auVar52,auVar101);
            auVar87 = vunpckhps_avx(auVar61,auVar72);
            auVar60 = vunpcklps_avx(auVar87,auVar60);
            auVar62._16_16_ = auVar79;
            auVar62._0_16_ = auVar79;
            auVar144._16_16_ = auVar49;
            auVar144._0_16_ = auVar49;
            auVar102._16_16_ = auVar67;
            auVar102._0_16_ = auVar67;
            auVar111._16_16_ = auVar70;
            auVar111._0_16_ = auVar70;
            auVar170._16_16_ = auVar78;
            auVar170._0_16_ = auVar78;
            uVar34 = *(undefined4 *)&(local_d30->org).field_0;
            auVar130._4_4_ = uVar34;
            auVar130._0_4_ = uVar34;
            auVar130._8_4_ = uVar34;
            auVar130._12_4_ = uVar34;
            auVar130._16_4_ = uVar34;
            auVar130._20_4_ = uVar34;
            auVar130._24_4_ = uVar34;
            auVar130._28_4_ = uVar34;
            uVar34 = *(undefined4 *)((long)&(local_d30->org).field_0 + 4);
            auVar135._4_4_ = uVar34;
            auVar135._0_4_ = uVar34;
            auVar135._8_4_ = uVar34;
            auVar135._12_4_ = uVar34;
            auVar135._16_4_ = uVar34;
            auVar135._20_4_ = uVar34;
            auVar135._24_4_ = uVar34;
            auVar135._28_4_ = uVar34;
            auVar166._16_16_ = auVar42;
            auVar166._0_16_ = auVar42;
            uVar34 = *(undefined4 *)((long)&(local_d30->org).field_0 + 8);
            auVar161._4_4_ = uVar34;
            auVar161._0_4_ = uVar34;
            auVar161._8_4_ = uVar34;
            auVar161._12_4_ = uVar34;
            auVar161._16_4_ = uVar34;
            auVar161._20_4_ = uVar34;
            auVar161._24_4_ = uVar34;
            auVar161._28_4_ = uVar34;
            local_c40 = vsubps_avx(auVar46,auVar130);
            local_c60 = vsubps_avx(auVar86,auVar135);
            local_b80._0_32_ = vsubps_avx(auVar60,auVar161);
            auVar86 = vsubps_avx(auVar62,auVar130);
            auVar60 = vsubps_avx(auVar144,auVar135);
            auVar87 = vsubps_avx(auVar102,auVar161);
            auVar46 = vsubps_avx(auVar111,auVar130);
            auVar52 = vsubps_avx(auVar170,auVar135);
            auVar64 = vsubps_avx(auVar166,auVar161);
            local_a20 = vsubps_avx(auVar46,local_c40);
            local_bc0 = vsubps_avx(auVar52,local_c60);
            local_ba0 = vsubps_avx(auVar64,local_b80._0_32_);
            auVar53._0_4_ = auVar46._0_4_ + local_c40._0_4_;
            auVar53._4_4_ = auVar46._4_4_ + local_c40._4_4_;
            auVar53._8_4_ = auVar46._8_4_ + local_c40._8_4_;
            auVar53._12_4_ = auVar46._12_4_ + local_c40._12_4_;
            auVar53._16_4_ = auVar46._16_4_ + local_c40._16_4_;
            auVar53._20_4_ = auVar46._20_4_ + local_c40._20_4_;
            auVar53._24_4_ = auVar46._24_4_ + local_c40._24_4_;
            auVar53._28_4_ = auVar46._28_4_ + local_c40._28_4_;
            auVar63._0_4_ = local_c60._0_4_ + auVar52._0_4_;
            auVar63._4_4_ = local_c60._4_4_ + auVar52._4_4_;
            auVar63._8_4_ = local_c60._8_4_ + auVar52._8_4_;
            auVar63._12_4_ = local_c60._12_4_ + auVar52._12_4_;
            auVar63._16_4_ = local_c60._16_4_ + auVar52._16_4_;
            auVar63._20_4_ = local_c60._20_4_ + auVar52._20_4_;
            auVar63._24_4_ = local_c60._24_4_ + auVar52._24_4_;
            auVar56._0_4_ = local_c60._28_4_;
            auVar63._28_4_ = auVar56._0_4_ + auVar52._28_4_;
            fVar136 = local_b80._0_4_;
            auVar103._0_4_ = auVar64._0_4_ + fVar136;
            fVar137 = local_b80._4_4_;
            auVar103._4_4_ = auVar64._4_4_ + fVar137;
            fVar138 = local_b80._8_4_;
            auVar103._8_4_ = auVar64._8_4_ + fVar138;
            auVar67._0_4_ = local_b80._12_4_;
            auVar103._12_4_ = auVar64._12_4_ + auVar67._0_4_;
            fVar162 = local_b80._16_4_;
            auVar103._16_4_ = auVar64._16_4_ + fVar162;
            fVar163 = local_b80._20_4_;
            auVar103._20_4_ = auVar64._20_4_ + fVar163;
            fVar164 = local_b80._24_4_;
            auVar103._24_4_ = auVar64._24_4_ + fVar164;
            auVar103._28_4_ = auVar64._28_4_ + local_b80._28_4_;
            auVar9._4_4_ = local_ba0._4_4_ * auVar63._4_4_;
            auVar9._0_4_ = local_ba0._0_4_ * auVar63._0_4_;
            auVar9._8_4_ = local_ba0._8_4_ * auVar63._8_4_;
            auVar9._12_4_ = local_ba0._12_4_ * auVar63._12_4_;
            auVar9._16_4_ = local_ba0._16_4_ * auVar63._16_4_;
            auVar9._20_4_ = local_ba0._20_4_ * auVar63._20_4_;
            auVar9._24_4_ = local_ba0._24_4_ * auVar63._24_4_;
            auVar9._28_4_ = uVar34;
            auVar78 = vfmsub231ps_fma(auVar9,local_bc0,auVar103);
            auVar10._4_4_ = local_a20._4_4_ * auVar103._4_4_;
            auVar10._0_4_ = local_a20._0_4_ * auVar103._0_4_;
            auVar10._8_4_ = local_a20._8_4_ * auVar103._8_4_;
            auVar10._12_4_ = local_a20._12_4_ * auVar103._12_4_;
            auVar10._16_4_ = local_a20._16_4_ * auVar103._16_4_;
            auVar10._20_4_ = local_a20._20_4_ * auVar103._20_4_;
            auVar10._24_4_ = local_a20._24_4_ * auVar103._24_4_;
            auVar10._28_4_ = auVar103._28_4_;
            auVar49 = vfmsub231ps_fma(auVar10,local_ba0,auVar53);
            auVar107._4_4_ = local_bc0._4_4_ * auVar53._4_4_;
            auVar107._0_4_ = local_bc0._0_4_ * auVar53._0_4_;
            auVar107._8_4_ = local_bc0._8_4_ * auVar53._8_4_;
            auVar107._12_4_ = local_bc0._12_4_ * auVar53._12_4_;
            auVar107._16_4_ = local_bc0._16_4_ * auVar53._16_4_;
            auVar107._20_4_ = local_bc0._20_4_ * auVar53._20_4_;
            auVar107._24_4_ = local_bc0._24_4_ * auVar53._24_4_;
            auVar107._28_4_ = auVar53._28_4_;
            auVar42 = vfmsub231ps_fma(auVar107,local_a20,auVar63);
            uVar34 = *(undefined4 *)((long)&(local_d30->dir).field_0 + 4);
            local_ce0._4_4_ = uVar34;
            local_ce0._0_4_ = uVar34;
            local_ce0._8_4_ = uVar34;
            local_ce0._12_4_ = uVar34;
            local_ce0._16_4_ = uVar34;
            local_ce0._20_4_ = uVar34;
            local_ce0._24_4_ = uVar34;
            local_ce0._28_4_ = uVar34;
            fStack_a38 = (local_d30->dir).field_0.m128[2];
            auVar11._4_4_ = fStack_a38 * auVar42._4_4_;
            auVar11._0_4_ = fStack_a38 * auVar42._0_4_;
            auVar11._8_4_ = fStack_a38 * auVar42._8_4_;
            auVar11._12_4_ = fStack_a38 * auVar42._12_4_;
            auVar11._16_4_ = fStack_a38 * 0.0;
            auVar11._20_4_ = fStack_a38 * 0.0;
            auVar11._24_4_ = fStack_a38 * 0.0;
            auVar11._28_4_ = auVar63._28_4_;
            auVar49 = vfmadd231ps_fma(auVar11,local_ce0,ZEXT1632(auVar49));
            uVar34 = *(undefined4 *)&(local_d30->dir).field_0;
            local_d00._4_4_ = uVar34;
            local_d00._0_4_ = uVar34;
            local_d00._8_4_ = uVar34;
            local_d00._12_4_ = uVar34;
            local_d00._16_4_ = uVar34;
            local_d00._20_4_ = uVar34;
            local_d00._24_4_ = uVar34;
            local_d00._28_4_ = uVar34;
            auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),local_d00,ZEXT1632(auVar78));
            local_a60 = vsubps_avx(local_c60,auVar60);
            auVar9 = vsubps_avx(local_b80._0_32_,auVar87);
            auVar54._0_4_ = local_c60._0_4_ + auVar60._0_4_;
            auVar54._4_4_ = local_c60._4_4_ + auVar60._4_4_;
            auVar54._8_4_ = local_c60._8_4_ + auVar60._8_4_;
            auVar54._12_4_ = local_c60._12_4_ + auVar60._12_4_;
            auVar54._16_4_ = local_c60._16_4_ + auVar60._16_4_;
            auVar54._20_4_ = local_c60._20_4_ + auVar60._20_4_;
            auVar54._24_4_ = local_c60._24_4_ + auVar60._24_4_;
            auVar54._28_4_ = auVar56._0_4_ + auVar60._28_4_;
            auVar104._0_4_ = auVar87._0_4_ + fVar136;
            auVar104._4_4_ = auVar87._4_4_ + fVar137;
            auVar104._8_4_ = auVar87._8_4_ + fVar138;
            auVar104._12_4_ = auVar87._12_4_ + auVar67._0_4_;
            auVar104._16_4_ = auVar87._16_4_ + fVar162;
            auVar104._20_4_ = auVar87._20_4_ + fVar163;
            auVar104._24_4_ = auVar87._24_4_ + fVar164;
            auVar104._28_4_ = auVar87._28_4_ + local_b80._28_4_;
            fVar168 = auVar9._0_4_;
            fVar172 = auVar9._4_4_;
            auVar12._4_4_ = fVar172 * auVar54._4_4_;
            auVar12._0_4_ = fVar168 * auVar54._0_4_;
            fVar173 = auVar9._8_4_;
            auVar12._8_4_ = fVar173 * auVar54._8_4_;
            fVar174 = auVar9._12_4_;
            auVar12._12_4_ = fVar174 * auVar54._12_4_;
            fVar175 = auVar9._16_4_;
            auVar12._16_4_ = fVar175 * auVar54._16_4_;
            fVar176 = auVar9._20_4_;
            auVar12._20_4_ = fVar176 * auVar54._20_4_;
            fVar177 = auVar9._24_4_;
            auVar12._24_4_ = fVar177 * auVar54._24_4_;
            auVar12._28_4_ = auVar56._0_4_;
            auVar42 = vfmsub231ps_fma(auVar12,local_a60,auVar104);
            local_a80 = vsubps_avx(local_c40,auVar86);
            auVar56._0_4_ = local_a80._0_4_;
            fVar75 = local_a80._4_4_;
            auVar13._4_4_ = auVar104._4_4_ * fVar75;
            auVar13._0_4_ = auVar104._0_4_ * auVar56._0_4_;
            fVar76 = local_a80._8_4_;
            auVar13._8_4_ = auVar104._8_4_ * fVar76;
            fVar77 = local_a80._12_4_;
            auVar13._12_4_ = auVar104._12_4_ * fVar77;
            fVar89 = local_a80._16_4_;
            auVar13._16_4_ = auVar104._16_4_ * fVar89;
            fVar96 = local_a80._20_4_;
            auVar13._20_4_ = auVar104._20_4_ * fVar96;
            fVar97 = local_a80._24_4_;
            auVar13._24_4_ = auVar104._24_4_ * fVar97;
            auVar13._28_4_ = local_a20._28_4_;
            auVar105._0_4_ = local_c40._0_4_ + auVar86._0_4_;
            auVar105._4_4_ = local_c40._4_4_ + auVar86._4_4_;
            auVar105._8_4_ = local_c40._8_4_ + auVar86._8_4_;
            auVar105._12_4_ = local_c40._12_4_ + auVar86._12_4_;
            auVar105._16_4_ = local_c40._16_4_ + auVar86._16_4_;
            auVar105._20_4_ = local_c40._20_4_ + auVar86._20_4_;
            auVar105._24_4_ = local_c40._24_4_ + auVar86._24_4_;
            auVar105._28_4_ = local_c40._28_4_ + auVar86._28_4_;
            auVar78 = vfmsub231ps_fma(auVar13,auVar9,auVar105);
            fVar139 = local_a60._0_4_;
            fVar146 = local_a60._4_4_;
            auVar14._4_4_ = fVar146 * auVar105._4_4_;
            auVar14._0_4_ = fVar139 * auVar105._0_4_;
            fVar147 = local_a60._8_4_;
            auVar14._8_4_ = fVar147 * auVar105._8_4_;
            fVar148 = local_a60._12_4_;
            auVar14._12_4_ = fVar148 * auVar105._12_4_;
            fVar149 = local_a60._16_4_;
            auVar14._16_4_ = fVar149 * auVar105._16_4_;
            fVar150 = local_a60._20_4_;
            auVar14._20_4_ = fVar150 * auVar105._20_4_;
            fVar151 = local_a60._24_4_;
            auVar14._24_4_ = fVar151 * auVar105._24_4_;
            auVar14._28_4_ = auVar105._28_4_;
            auVar79 = vfmsub231ps_fma(auVar14,local_a80,auVar54);
            auVar106._0_4_ = fStack_a38 * auVar79._0_4_;
            auVar106._4_4_ = fStack_a38 * auVar79._4_4_;
            auVar106._8_4_ = fStack_a38 * auVar79._8_4_;
            auVar106._12_4_ = fStack_a38 * auVar79._12_4_;
            auVar106._16_4_ = fStack_a38 * 0.0;
            auVar106._20_4_ = fStack_a38 * 0.0;
            auVar106._24_4_ = fStack_a38 * 0.0;
            auVar106._28_4_ = 0;
            auVar78 = vfmadd231ps_fma(auVar106,local_ce0,ZEXT1632(auVar78));
            auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),local_d00,ZEXT1632(auVar42));
            auVar10 = vsubps_avx(auVar86,auVar46);
            auVar112._0_4_ = auVar86._0_4_ + auVar46._0_4_;
            auVar112._4_4_ = auVar86._4_4_ + auVar46._4_4_;
            auVar112._8_4_ = auVar86._8_4_ + auVar46._8_4_;
            auVar112._12_4_ = auVar86._12_4_ + auVar46._12_4_;
            auVar112._16_4_ = auVar86._16_4_ + auVar46._16_4_;
            auVar112._20_4_ = auVar86._20_4_ + auVar46._20_4_;
            auVar112._24_4_ = auVar86._24_4_ + auVar46._24_4_;
            auVar112._28_4_ = auVar86._28_4_ + auVar46._28_4_;
            auVar46 = vsubps_avx(auVar60,auVar52);
            auVar84._0_4_ = auVar60._0_4_ + auVar52._0_4_;
            auVar84._4_4_ = auVar60._4_4_ + auVar52._4_4_;
            auVar84._8_4_ = auVar60._8_4_ + auVar52._8_4_;
            auVar84._12_4_ = auVar60._12_4_ + auVar52._12_4_;
            auVar84._16_4_ = auVar60._16_4_ + auVar52._16_4_;
            auVar84._20_4_ = auVar60._20_4_ + auVar52._20_4_;
            auVar84._24_4_ = auVar60._24_4_ + auVar52._24_4_;
            auVar84._28_4_ = auVar60._28_4_ + auVar52._28_4_;
            auVar52 = vsubps_avx(auVar87,auVar64);
            auVar73._0_4_ = auVar87._0_4_ + auVar64._0_4_;
            auVar73._4_4_ = auVar87._4_4_ + auVar64._4_4_;
            auVar73._8_4_ = auVar87._8_4_ + auVar64._8_4_;
            auVar73._12_4_ = auVar87._12_4_ + auVar64._12_4_;
            auVar73._16_4_ = auVar87._16_4_ + auVar64._16_4_;
            auVar73._20_4_ = auVar87._20_4_ + auVar64._20_4_;
            auVar73._24_4_ = auVar87._24_4_ + auVar64._24_4_;
            auVar73._28_4_ = auVar87._28_4_ + auVar64._28_4_;
            auVar119._0_4_ = auVar84._0_4_ * auVar52._0_4_;
            auVar119._4_4_ = auVar84._4_4_ * auVar52._4_4_;
            auVar119._8_4_ = auVar84._8_4_ * auVar52._8_4_;
            auVar119._12_4_ = auVar84._12_4_ * auVar52._12_4_;
            auVar119._16_4_ = auVar84._16_4_ * auVar52._16_4_;
            auVar119._20_4_ = auVar84._20_4_ * auVar52._20_4_;
            auVar119._24_4_ = auVar84._24_4_ * auVar52._24_4_;
            auVar119._28_4_ = 0;
            auVar79 = vfmsub231ps_fma(auVar119,auVar46,auVar73);
            auVar87._4_4_ = auVar73._4_4_ * auVar10._4_4_;
            auVar87._0_4_ = auVar73._0_4_ * auVar10._0_4_;
            auVar87._8_4_ = auVar73._8_4_ * auVar10._8_4_;
            auVar87._12_4_ = auVar73._12_4_ * auVar10._12_4_;
            auVar87._16_4_ = auVar73._16_4_ * auVar10._16_4_;
            auVar87._20_4_ = auVar73._20_4_ * auVar10._20_4_;
            auVar87._24_4_ = auVar73._24_4_ * auVar10._24_4_;
            auVar87._28_4_ = auVar73._28_4_;
            auVar42 = vfmsub231ps_fma(auVar87,auVar52,auVar112);
            auVar64._4_4_ = auVar112._4_4_ * auVar46._4_4_;
            auVar64._0_4_ = auVar112._0_4_ * auVar46._0_4_;
            auVar64._8_4_ = auVar112._8_4_ * auVar46._8_4_;
            auVar64._12_4_ = auVar112._12_4_ * auVar46._12_4_;
            auVar64._16_4_ = auVar112._16_4_ * auVar46._16_4_;
            auVar64._20_4_ = auVar112._20_4_ * auVar46._20_4_;
            auVar64._24_4_ = auVar112._24_4_ * auVar46._24_4_;
            auVar64._28_4_ = auVar112._28_4_;
            auVar80 = vfmsub231ps_fma(auVar64,auVar10,auVar84);
            _local_a40 = CONCAT44(fStack_a38,fStack_a38);
            fStack_a34 = fStack_a38;
            fStack_a30 = fStack_a38;
            fStack_a2c = fStack_a38;
            fStack_a28 = fStack_a38;
            fStack_a24 = fStack_a38;
            auVar15._4_4_ = fStack_a38 * auVar80._4_4_;
            auVar15._0_4_ = fStack_a38 * auVar80._0_4_;
            auVar15._8_4_ = fStack_a38 * auVar80._8_4_;
            auVar15._12_4_ = fStack_a38 * auVar80._12_4_;
            auVar15._16_4_ = fStack_a38 * 0.0;
            auVar15._20_4_ = fStack_a38 * 0.0;
            auVar15._24_4_ = fStack_a38 * 0.0;
            auVar15._28_4_ = auVar84._28_4_;
            auVar42 = vfmadd231ps_fma(auVar15,local_ce0,ZEXT1632(auVar42));
            auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),local_d00,ZEXT1632(auVar79));
            fVar152 = auVar42._0_4_ + auVar49._0_4_ + auVar78._0_4_;
            fVar157 = auVar42._4_4_ + auVar49._4_4_ + auVar78._4_4_;
            fVar158 = auVar42._8_4_ + auVar49._8_4_ + auVar78._8_4_;
            fVar159 = auVar42._12_4_ + auVar49._12_4_ + auVar78._12_4_;
            local_920 = ZEXT1632(CONCAT412(fVar159,CONCAT48(fVar158,CONCAT44(fVar157,fVar152))));
            auVar74._8_4_ = 0x7fffffff;
            auVar74._0_8_ = 0x7fffffff7fffffff;
            auVar74._12_4_ = 0x7fffffff;
            auVar74._16_4_ = 0x7fffffff;
            auVar74._20_4_ = 0x7fffffff;
            auVar74._24_4_ = 0x7fffffff;
            auVar74._28_4_ = 0x7fffffff;
            auVar64 = ZEXT1632(auVar49);
            auVar86 = vminps_avx(auVar64,ZEXT1632(auVar78));
            auVar86 = vminps_avx(auVar86,ZEXT1632(auVar42));
            local_9e0 = vandps_avx(local_920,auVar74);
            fVar116 = local_9e0._0_4_ * 1.1920929e-07;
            fVar122 = local_9e0._4_4_ * 1.1920929e-07;
            auVar16._4_4_ = fVar122;
            auVar16._0_4_ = fVar116;
            fVar123 = local_9e0._8_4_ * 1.1920929e-07;
            auVar16._8_4_ = fVar123;
            fVar124 = local_9e0._12_4_ * 1.1920929e-07;
            auVar16._12_4_ = fVar124;
            fVar125 = local_9e0._16_4_ * 1.1920929e-07;
            auVar16._16_4_ = fVar125;
            fVar126 = local_9e0._20_4_ * 1.1920929e-07;
            auVar16._20_4_ = fVar126;
            fVar127 = local_9e0._24_4_ * 1.1920929e-07;
            auVar16._24_4_ = fVar127;
            auVar16._28_4_ = 0x34000000;
            auVar131._0_8_ = CONCAT44(fVar122,fVar116) ^ 0x8000000080000000;
            auVar131._8_4_ = -fVar123;
            auVar131._12_4_ = -fVar124;
            auVar131._16_4_ = -fVar125;
            auVar131._20_4_ = -fVar126;
            auVar131._24_4_ = -fVar127;
            auVar131._28_4_ = 0xb4000000;
            auVar86 = vcmpps_avx(auVar86,auVar131,5);
            auVar107 = ZEXT1632(auVar78);
            auVar60 = vmaxps_avx(auVar64,auVar107);
            auVar60 = vmaxps_avx(auVar60,ZEXT1632(auVar42));
            auVar60 = vcmpps_avx(auVar60,auVar16,2);
            auVar60 = vorps_avx(auVar86,auVar60);
            auVar87 = local_a00 & auVar60;
            if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar87 >> 0x7f,0) != '\0') ||
                  (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar87 >> 0xbf,0) != '\0') ||
                (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar87[0x1f] < '\0') {
              local_aa0 = auVar60;
              auVar17._4_4_ = local_ba0._4_4_ * fVar146;
              auVar17._0_4_ = local_ba0._0_4_ * fVar139;
              auVar17._8_4_ = local_ba0._8_4_ * fVar147;
              auVar17._12_4_ = local_ba0._12_4_ * fVar148;
              auVar17._16_4_ = local_ba0._16_4_ * fVar149;
              auVar17._20_4_ = local_ba0._20_4_ * fVar150;
              auVar17._24_4_ = local_ba0._24_4_ * fVar151;
              auVar17._28_4_ = auVar60._28_4_;
              local_980 = 0x80000000;
              uStack_97c = 0x80000000;
              uStack_978 = 0x80000000;
              uStack_974 = 0x80000000;
              uStack_970 = 0x80000000;
              uStack_96c = 0x80000000;
              uStack_968 = 0x80000000;
              uStack_964 = 0x80000000;
              auVar18._4_4_ = local_bc0._4_4_ * fVar75;
              auVar18._0_4_ = local_bc0._0_4_ * auVar56._0_4_;
              auVar18._8_4_ = local_bc0._8_4_ * fVar76;
              auVar18._12_4_ = local_bc0._12_4_ * fVar77;
              auVar18._16_4_ = local_bc0._16_4_ * fVar89;
              auVar18._20_4_ = local_bc0._20_4_ * fVar96;
              auVar18._24_4_ = local_bc0._24_4_ * fVar97;
              auVar18._28_4_ = auVar86._28_4_;
              auVar49 = vfmsub213ps_fma(local_bc0,auVar9,auVar17);
              auVar19._4_4_ = fVar172 * auVar46._4_4_;
              auVar19._0_4_ = fVar168 * auVar46._0_4_;
              auVar19._8_4_ = fVar173 * auVar46._8_4_;
              auVar19._12_4_ = fVar174 * auVar46._12_4_;
              auVar19._16_4_ = fVar175 * auVar46._16_4_;
              auVar19._20_4_ = fVar176 * auVar46._20_4_;
              auVar19._24_4_ = fVar177 * auVar46._24_4_;
              auVar19._28_4_ = 0x34000000;
              local_bc0 = local_920;
              auVar20._4_4_ = fVar75 * auVar52._4_4_;
              auVar20._0_4_ = auVar56._0_4_ * auVar52._0_4_;
              auVar20._8_4_ = fVar76 * auVar52._8_4_;
              auVar20._12_4_ = fVar77 * auVar52._12_4_;
              auVar20._16_4_ = fVar89 * auVar52._16_4_;
              auVar20._20_4_ = fVar96 * auVar52._20_4_;
              auVar20._24_4_ = fVar97 * auVar52._24_4_;
              auVar20._28_4_ = 0;
              auVar78 = vfmsub213ps_fma(auVar52,local_a60,auVar19);
              auVar86 = vandps_avx(auVar17,auVar74);
              auVar87 = vandps_avx(auVar19,auVar74);
              auVar86 = vcmpps_avx(auVar86,auVar87,1);
              auVar52 = vblendvps_avx(ZEXT1632(auVar78),ZEXT1632(auVar49),auVar86);
              auVar21._4_4_ = fVar146 * auVar10._4_4_;
              auVar21._0_4_ = fVar139 * auVar10._0_4_;
              auVar21._8_4_ = fVar147 * auVar10._8_4_;
              auVar21._12_4_ = fVar148 * auVar10._12_4_;
              auVar21._16_4_ = fVar149 * auVar10._16_4_;
              auVar21._20_4_ = fVar150 * auVar10._20_4_;
              auVar21._24_4_ = fVar151 * auVar10._24_4_;
              auVar21._28_4_ = auVar86._28_4_;
              auVar49 = vfmsub213ps_fma(auVar10,auVar9,auVar20);
              auVar94._0_4_ = local_a20._0_4_ * fVar168;
              auVar94._4_4_ = local_a20._4_4_ * fVar172;
              auVar94._8_4_ = local_a20._8_4_ * fVar173;
              auVar94._12_4_ = local_a20._12_4_ * fVar174;
              auVar94._16_4_ = local_a20._16_4_ * fVar175;
              auVar94._20_4_ = local_a20._20_4_ * fVar176;
              auVar94._24_4_ = local_a20._24_4_ * fVar177;
              auVar94._28_4_ = 0;
              auVar78 = vfmsub213ps_fma(local_ba0,local_a80,auVar94);
              auVar86 = vandps_avx(auVar94,auVar74);
              auVar87 = vandps_avx(auVar20,auVar74);
              auVar86 = vcmpps_avx(auVar86,auVar87,1);
              auVar10 = vblendvps_avx(ZEXT1632(auVar49),ZEXT1632(auVar78),auVar86);
              auVar49 = vfmsub213ps_fma(local_a20,local_a60,auVar18);
              auVar78 = vfmsub213ps_fma(auVar46,local_a80,auVar21);
              auVar86 = vandps_avx(auVar18,auVar74);
              auVar87 = vandps_avx(auVar21,auVar74);
              auVar86 = vcmpps_avx(auVar86,auVar87,1);
              auVar86 = vblendvps_avx(ZEXT1632(auVar78),ZEXT1632(auVar49),auVar86);
              fVar89 = auVar86._0_4_;
              auVar46._0_4_ = fVar89 * fStack_a38;
              fVar96 = auVar86._4_4_;
              auVar46._4_4_ = fVar96 * fStack_a38;
              fVar97 = auVar86._8_4_;
              auVar46._8_4_ = fVar97 * fStack_a38;
              fVar116 = auVar86._12_4_;
              auVar46._12_4_ = fVar116 * fStack_a38;
              fVar122 = auVar86._16_4_;
              auVar46._16_4_ = fVar122 * fStack_a38;
              fVar123 = auVar86._20_4_;
              auVar46._20_4_ = fVar123 * fStack_a38;
              fVar124 = auVar86._24_4_;
              auVar46._24_4_ = fVar124 * fStack_a38;
              auVar46._28_4_ = 0;
              auVar49 = vfmadd213ps_fma(local_ce0,auVar10,auVar46);
              auVar49 = vfmadd213ps_fma(local_d00,auVar52,ZEXT1632(auVar49));
              auVar56._0_4_ = auVar49._0_4_ + auVar49._0_4_;
              fVar75 = auVar49._4_4_ + auVar49._4_4_;
              fVar76 = auVar49._8_4_ + auVar49._8_4_;
              fVar77 = auVar49._12_4_ + auVar49._12_4_;
              auVar46 = ZEXT1632(CONCAT412(fVar77,CONCAT48(fVar76,CONCAT44(fVar75,auVar56._0_4_))));
              auVar47._0_4_ = fVar89 * fVar136;
              auVar47._4_4_ = fVar96 * fVar137;
              auVar47._8_4_ = fVar97 * fVar138;
              auVar47._12_4_ = fVar116 * auVar67._0_4_;
              auVar47._16_4_ = fVar122 * fVar162;
              auVar47._20_4_ = fVar123 * fVar163;
              auVar47._24_4_ = fVar124 * fVar164;
              auVar47._28_4_ = 0;
              auVar49 = vfmadd213ps_fma(local_c60,auVar10,auVar47);
              auVar86 = vrcpps_avx(auVar46);
              auVar78 = vfmadd213ps_fma(local_c40,auVar52,ZEXT1632(auVar49));
              auVar120._8_4_ = 0x3f800000;
              auVar120._0_8_ = 0x3f8000003f800000;
              auVar120._12_4_ = 0x3f800000;
              auVar120._16_4_ = 0x3f800000;
              auVar120._20_4_ = 0x3f800000;
              auVar120._24_4_ = 0x3f800000;
              auVar120._28_4_ = 0x3f800000;
              auVar49 = vfnmadd213ps_fma(auVar86,auVar46,auVar120);
              auVar49 = vfmadd132ps_fma(ZEXT1632(auVar49),auVar86,auVar86);
              local_880._28_4_ = auVar86._28_4_;
              local_880._0_28_ =
                   ZEXT1628(CONCAT412((auVar78._12_4_ + auVar78._12_4_) * auVar49._12_4_,
                                      CONCAT48((auVar78._8_4_ + auVar78._8_4_) * auVar49._8_4_,
                                               CONCAT44((auVar78._4_4_ + auVar78._4_4_) *
                                                        auVar49._4_4_,
                                                        (auVar78._0_4_ + auVar78._0_4_) *
                                                        auVar49._0_4_))));
              uVar34 = *(undefined4 *)((long)&(local_d30->org).field_0 + 0xc);
              auVar85._4_4_ = uVar34;
              auVar85._0_4_ = uVar34;
              auVar85._8_4_ = uVar34;
              auVar85._12_4_ = uVar34;
              auVar85._16_4_ = uVar34;
              auVar85._20_4_ = uVar34;
              auVar85._24_4_ = uVar34;
              auVar85._28_4_ = uVar34;
              auVar86 = vcmpps_avx(auVar85,local_880,2);
              fVar136 = local_d30->tfar;
              auVar113._4_4_ = fVar136;
              auVar113._0_4_ = fVar136;
              auVar113._8_4_ = fVar136;
              auVar113._12_4_ = fVar136;
              auVar113._16_4_ = fVar136;
              auVar113._20_4_ = fVar136;
              auVar113._24_4_ = fVar136;
              auVar113._28_4_ = fVar136;
              auVar87 = vcmpps_avx(local_880,auVar113,2);
              auVar86 = vandps_avx(auVar87,auVar86);
              auVar114._0_8_ = CONCAT44(fVar75,auVar56._0_4_) ^ 0x8000000080000000;
              auVar114._8_4_ = -fVar76;
              auVar114._12_4_ = -fVar77;
              auVar114._16_4_ = 0x80000000;
              auVar114._20_4_ = 0x80000000;
              auVar114._24_4_ = 0x80000000;
              auVar114._28_4_ = 0x80000000;
              auVar87 = vcmpps_avx(auVar46,auVar114,4);
              auVar86 = vandps_avx(auVar87,auVar86);
              auVar60 = vandps_avx(auVar60,local_a00);
              auVar86 = vpslld_avx2(auVar86,0x1f);
              auVar87 = vpsrad_avx2(auVar86,0x1f);
              auVar86 = auVar60 & auVar87;
              if ((((((((auVar86 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar86 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar86 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar86 >> 0x7f,0) != '\0') ||
                    (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar86 >> 0xbf,0) != '\0') ||
                  (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar86[0x1f] < '\0') {
                auVar2._0_4_ = local_d30->tfar;
                auVar2._4_4_ = local_d30->mask;
                auVar2._8_4_ = local_d30->id;
                auVar2._12_4_ = local_d30->flags;
                local_8e0 = vandps_avx(auVar87,auVar60);
                uVar28 = vextractps_avx(auVar2,1);
                local_900 = &local_d31;
                auVar86 = vsubps_avx(local_920,auVar107);
                local_960 = vblendvps_avx(auVar64,auVar86,local_9a0);
                auVar86 = vsubps_avx(local_920,auVar64);
                local_940 = vblendvps_avx(auVar107,auVar86,local_9a0);
                local_860._0_4_ = auVar52._0_4_ * (float)local_9c0._0_4_;
                local_860._4_4_ = auVar52._4_4_ * (float)local_9c0._4_4_;
                local_860._8_4_ = auVar52._8_4_ * fStack_9b8;
                local_860._12_4_ = auVar52._12_4_ * fStack_9b4;
                local_860._16_4_ = auVar52._16_4_ * fStack_9b0;
                local_860._20_4_ = auVar52._20_4_ * fStack_9ac;
                local_860._24_4_ = auVar52._24_4_ * fStack_9a8;
                local_860._28_4_ = 0;
                local_840[0] = (float)local_9c0._0_4_ * auVar10._0_4_;
                local_840[1] = (float)local_9c0._4_4_ * auVar10._4_4_;
                local_840[2] = fStack_9b8 * auVar10._8_4_;
                local_840[3] = fStack_9b4 * auVar10._12_4_;
                fStack_830 = fStack_9b0 * auVar10._16_4_;
                fStack_82c = fStack_9ac * auVar10._20_4_;
                fStack_828 = fStack_9a8 * auVar10._24_4_;
                uStack_824 = auVar10._28_4_;
                local_820._4_4_ = (float)local_9c0._4_4_ * fVar96;
                local_820._0_4_ = (float)local_9c0._0_4_ * fVar89;
                local_820._8_4_ = fStack_9b8 * fVar97;
                local_820._12_4_ = fStack_9b4 * fVar116;
                local_820._16_4_ = fStack_9b0 * fVar122;
                local_820._20_4_ = fStack_9ac * fVar123;
                local_820._24_4_ = fStack_9a8 * fVar124;
                local_820._28_4_ = auVar10._28_4_;
                pGVar35 = (local_c68->geometries).items[local_d08].ptr;
                if ((pGVar35->mask & uVar28) != 0) {
                  pRVar33 = local_d28->args;
                  if ((pRVar33->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar35->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_014a9669:
                    local_d30->tfar = -INFINITY;
                    return;
                  }
                  auVar55._0_8_ = (ulong)CONCAT24(uVar3,(uint)uVar3) & 0x7fff00007fff;
                  auVar55._8_4_ = local_d18;
                  auVar55._12_4_ = local_d18;
                  auVar55._16_4_ = local_d18;
                  auVar55._20_4_ = local_d18;
                  auVar55._24_4_ = local_d18;
                  auVar55._28_4_ = local_d18;
                  auVar86 = vpaddd_avx2(auVar55,_DAT_01fb7740);
                  auVar65._0_8_ = (ulong)CONCAT24(uVar4,(uint)uVar4) & 0x7fff00007fff;
                  auVar65._8_4_ = local_d1c;
                  auVar65._12_4_ = local_d1c;
                  auVar65._16_4_ = local_d1c;
                  auVar65._20_4_ = local_d1c;
                  auVar65._24_4_ = local_d1c;
                  auVar65._28_4_ = local_d1c;
                  auVar93._0_4_ = (float)(int)(*(ushort *)(local_c70 + 8 + local_c78) - 1);
                  auVar93._4_12_ = auVar9._4_12_;
                  auVar87 = vpaddd_avx2(auVar65,_DAT_01fb7760);
                  auVar49 = vrcpss_avx(auVar93,auVar93);
                  auVar78 = vfnmadd213ss_fma(auVar93,auVar49,SUB6416(ZEXT464(0x40000000),0));
                  fVar136 = auVar49._0_4_ * auVar78._0_4_;
                  auVar100._0_4_ = (float)(int)(*(ushort *)(local_c70 + 10 + local_c78) - 1);
                  auVar100._4_12_ = auVar9._4_12_;
                  auVar49 = vrcpss_avx(auVar100,auVar100);
                  auVar78 = vfnmadd213ss_fma(auVar100,auVar49,SUB6416(ZEXT464(0x40000000),0));
                  fVar137 = auVar49._0_4_ * auVar78._0_4_;
                  auVar60 = vcvtdq2ps_avx(auVar86);
                  auVar87 = vcvtdq2ps_avx(auVar87);
                  auVar86 = vrcpps_avx(local_920);
                  auVar88._8_4_ = 0x3f800000;
                  auVar88._0_8_ = 0x3f8000003f800000;
                  auVar88._12_4_ = 0x3f800000;
                  auVar88._16_4_ = 0x3f800000;
                  auVar88._20_4_ = 0x3f800000;
                  auVar88._24_4_ = 0x3f800000;
                  auVar88._28_4_ = 0x3f800000;
                  auVar49 = vfnmadd213ps_fma(local_920,auVar86,auVar88);
                  auVar49 = vfmadd132ps_fma(ZEXT1632(auVar49),auVar86,auVar86);
                  auVar66._8_4_ = 0x219392ef;
                  auVar66._0_8_ = 0x219392ef219392ef;
                  auVar66._12_4_ = 0x219392ef;
                  auVar66._16_4_ = 0x219392ef;
                  auVar66._20_4_ = 0x219392ef;
                  auVar66._24_4_ = 0x219392ef;
                  auVar66._28_4_ = 0x219392ef;
                  auVar86 = vcmpps_avx(local_9e0,auVar66,5);
                  auVar86 = vandps_avx(ZEXT1632(auVar49),auVar86);
                  auVar22._4_4_ =
                       (fVar157 * auVar60._4_4_ + local_960._4_4_) * fVar136 * auVar86._4_4_;
                  auVar22._0_4_ =
                       (fVar152 * auVar60._0_4_ + local_960._0_4_) * fVar136 * auVar86._0_4_;
                  auVar22._8_4_ =
                       (fVar158 * auVar60._8_4_ + local_960._8_4_) * fVar136 * auVar86._8_4_;
                  auVar22._12_4_ =
                       (fVar159 * auVar60._12_4_ + local_960._12_4_) * fVar136 * auVar86._12_4_;
                  auVar22._16_4_ =
                       (auVar60._16_4_ * 0.0 + local_960._16_4_) * fVar136 * auVar86._16_4_;
                  auVar22._20_4_ =
                       (auVar60._20_4_ * 0.0 + local_960._20_4_) * fVar136 * auVar86._20_4_;
                  auVar22._24_4_ =
                       (auVar60._24_4_ * 0.0 + local_960._24_4_) * fVar136 * auVar86._24_4_;
                  auVar22._28_4_ = auVar60._28_4_ + local_960._28_4_;
                  local_8c0 = vminps_avx(auVar22,auVar88);
                  auVar23._4_4_ =
                       (fVar157 * auVar87._4_4_ + local_940._4_4_) * fVar137 * auVar86._4_4_;
                  auVar23._0_4_ =
                       (fVar152 * auVar87._0_4_ + local_940._0_4_) * fVar137 * auVar86._0_4_;
                  auVar23._8_4_ =
                       (fVar158 * auVar87._8_4_ + local_940._8_4_) * fVar137 * auVar86._8_4_;
                  auVar23._12_4_ =
                       (fVar159 * auVar87._12_4_ + local_940._12_4_) * fVar137 * auVar86._12_4_;
                  auVar23._16_4_ =
                       (auVar87._16_4_ * 0.0 + local_940._16_4_) * fVar137 * auVar86._16_4_;
                  auVar23._20_4_ =
                       (auVar87._20_4_ * 0.0 + local_940._20_4_) * fVar137 * auVar86._20_4_;
                  auVar23._24_4_ =
                       (auVar87._24_4_ * 0.0 + local_940._24_4_) * fVar137 * auVar86._24_4_;
                  auVar23._28_4_ = auVar87._28_4_ + local_940._28_4_;
                  local_8a0 = vminps_avx(auVar23,auVar88);
                  uVar28 = vmovmskps_avx(local_8e0);
                  lVar25 = 0;
                  uVar38 = (ulong)uVar28;
                  for (uVar27 = uVar38; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000
                      ) {
                    lVar25 = lVar25 + 1;
                  }
                  local_c40._0_8_ = pRVar33;
                  local_b80._0_16_ = auVar2;
                  local_c60._0_8_ = pGVar35;
                  while (uVar38 != 0) {
                    local_d00._0_8_ = uVar38;
                    local_c14 = *(undefined4 *)(local_8c0 + lVar25 * 4);
                    local_c10 = *(undefined4 *)(local_8a0 + lVar25 * 4);
                    local_d30->tfar = *(float *)(local_880 + lVar25 * 4);
                    local_bf0.context = local_d28->user;
                    local_c20 = local_840[lVar25 + -8];
                    local_c1c = local_840[lVar25];
                    local_ce0._0_8_ = lVar25;
                    local_c18 = *(undefined4 *)(local_820 + lVar25 * 4);
                    local_c0c = (undefined4)local_c98;
                    local_c08 = (undefined4)local_d08;
                    local_c04 = (local_bf0.context)->instID[0];
                    local_c00 = (local_bf0.context)->instPrimID[0];
                    local_d14 = -1;
                    local_bf0.valid = &local_d14;
                    local_bf0.geometryUserPtr = pGVar35->userPtr;
                    local_bf0.ray = (RTCRayN *)local_d30;
                    local_bf0.hit = (RTCHitN *)&local_c20;
                    local_bf0.N = 1;
                    if (pGVar35->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_014a952b:
                      if ((pRVar33->filter == (RTCFilterFunctionN)0x0) ||
                         (((pRVar33->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          ((*(byte *)(local_c60._0_8_ + 0x3e) & 0x40) == 0)))) goto LAB_014a9669;
                      (*pRVar33->filter)(&local_bf0);
                      if (*local_bf0.valid != 0) goto LAB_014a9669;
                    }
                    else {
                      (*pGVar35->occlusionFilterN)(&local_bf0);
                      pRVar33 = (RTCIntersectArguments *)local_c40._0_8_;
                      if (*local_bf0.valid != 0) goto LAB_014a952b;
                    }
                    local_d30->tfar = (float)local_b80._0_4_;
                    lVar25 = 0;
                    uVar38 = local_d00._0_8_ ^ 1L << (local_ce0._0_8_ & 0x3f);
                    for (uVar27 = uVar38; (uVar27 & 1) == 0;
                        uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                      lVar25 = lVar25 + 1;
                    }
                    pRVar33 = (RTCIntersectArguments *)local_c40._0_8_;
                    pGVar35 = (Geometry *)local_c60._0_8_;
                  }
                }
              }
            }
            uVar36 = local_c80 - 1 & local_c80;
            context = local_d28;
            ray = local_d30;
            puVar37 = local_d10;
            uVar27 = local_ca0;
            uVar38 = local_ca8;
          }
          auVar115 = ZEXT1664(local_b50);
          This = (Intersectors *)0x0;
          auVar67._0_4_ = local_ad0;
          fVar136 = fStack_acc;
          fVar137 = fStack_ac8;
          fVar138 = fStack_ac4;
          auVar56._0_4_ = local_b00;
          fVar162 = fStack_afc;
          fVar163 = fStack_af8;
          fVar164 = fStack_af4;
        }
        goto LAB_014a8699;
      }
    }
  }
  return;
LAB_014a87e1:
  do {
    *puVar37 = uVar36;
    puVar37 = puVar37 + 1;
    This = (Intersectors *)0x0;
    for (uVar36 = uVar29; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
      This = (Intersectors *)((long)&This->ptr + 1);
    }
    uVar29 = uVar29 - 1 & uVar29;
    uVar36 = *(ulong *)(uVar24 + (long)This * 8);
  } while (uVar29 != 0);
  goto LAB_014a86aa;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }